

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O0

int oonf_cfg_load_subsystems(void)

{
  list_entity *plVar1;
  bool bVar2;
  int iVar3;
  oonf_subsystem *poVar4;
  long lVar5;
  size_t sVar6;
  oonf_subsystem *local_f8;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  char *pcStack_60;
  _Bool found;
  char *ptr;
  oonf_subsystem_namebuf nbuf;
  oonf_subsystem *plugin_it;
  oonf_subsystem *plugin;
  
  for (pcStack_60 = config_global.plugin.value;
      pcStack_60 != (char *)0x0 &&
      pcStack_60 < config_global.plugin.value + config_global.plugin.length;
      pcStack_60 = pcStack_60 + sVar6 + 1) {
    if (*pcStack_60 != '\0') {
      oonf_subsystem_extract_name((oonf_subsystem_namebuf *)&ptr,pcStack_60);
      poVar4 = oonf_cfg_load_subsystem((char *)&ptr);
      if ((poVar4 == (oonf_subsystem *)0x0) && ((config_global.failfast & 1U) != 0)) {
        return -1;
      }
    }
    sVar6 = strlen(pcStack_60);
  }
  plugin_it = (oonf_subsystem *)(oonf_plugin_tree.list_head.next + -7);
  plVar1 = (oonf_plugin_tree.list_head.next)->next;
  do {
    nbuf.name._24_8_ = plVar1 + -7;
    if ((plugin_it->_node).list.prev == oonf_plugin_tree.list_head.prev) {
      plugin_it = (oonf_subsystem *)(oonf_plugin_tree.list_head.next + -7);
      plVar1 = (oonf_plugin_tree.list_head.next)->next;
      while( true ) {
        nbuf.name._24_8_ = plVar1 + -7;
        if ((plugin_it->_node).list.prev == oonf_plugin_tree.list_head.prev) {
          return 0;
        }
        iVar3 = oonf_subsystem_call_init(plugin_it);
        if (iVar3 != 0) break;
        plugin_it = (oonf_subsystem *)nbuf.name._24_8_;
        plVar1 = *(list_entity **)(nbuf.name._24_8_ + 0x70);
      }
      return -1;
    }
    if (plugin_it->_dlhandle != (void *)0x0) {
      bVar2 = false;
      for (pcStack_60 = config_global.plugin.value;
          pcStack_60 != (char *)0x0 &&
          pcStack_60 < config_global.plugin.value + config_global.plugin.length;
          pcStack_60 = pcStack_60 + sVar6 + 1) {
        oonf_subsystem_extract_name((oonf_subsystem_namebuf *)&ptr,pcStack_60);
        lVar5 = avl_find(&oonf_plugin_tree,&ptr);
        if (lVar5 == 0) {
          local_f8 = (oonf_subsystem *)0x0;
        }
        else {
          local_f8 = (oonf_subsystem *)(lVar5 + -0x70);
        }
        if (local_f8 == plugin_it) {
          bVar2 = true;
          break;
        }
        sVar6 = strlen(pcStack_60);
      }
      if (!bVar2) {
        oonf_subsystem_unload(plugin_it);
      }
    }
    plugin_it = (oonf_subsystem *)nbuf.name._24_8_;
    plVar1 = *(list_entity **)(nbuf.name._24_8_ + 0x70);
  } while( true );
}

Assistant:

int
oonf_cfg_load_subsystems(void) {
  struct oonf_subsystem *plugin, *plugin_it;
  struct oonf_subsystem_namebuf nbuf;
  char *ptr;
  bool found;

  /* load plugins */
  strarray_for_each_element(&config_global.plugin, ptr) {
    /* ignore empty strings */
    if (*ptr == 0) {
      continue;
    }

    oonf_subsystem_extract_name(&nbuf, ptr);

    if (oonf_cfg_load_subsystem(nbuf.name) == NULL && config_global.failfast) {
      return -1;
    }
  }

  /* unload all plugins that are not in use anymore */
  avl_for_each_element_safe(&oonf_plugin_tree, plugin, _node, plugin_it) {
    if (plugin->_dlhandle == NULL) {
      /* ignore static plugins */
      continue;
    }

    found = false;

    /* search if plugin should still be active */
    strarray_for_each_element(&config_global.plugin, ptr) {
      oonf_subsystem_extract_name(&nbuf, ptr);

      if (oonf_subsystem_get(nbuf.name) == plugin) {
        found = true;
        break;
      }
    }

    if (!found) {
      /* if not, unload it (if not static) */
      oonf_subsystem_unload(plugin);
    }
  }

  /* initialize all plugins */
  avl_for_each_element_safe(&oonf_plugin_tree, plugin, _node, plugin_it) {
    if (oonf_subsystem_call_init(plugin)) {
      return -1;
    }
  }
  return 0;
}